

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O1

int __thiscall
chrono::ChFunction::FileAsciiPairsSave
          (ChFunction *this,ChStreamOutAscii *m_file,double mxmin,double mxmax,int msamples)

{
  double dVar1;
  ChException *pCVar2;
  double dVal;
  double dVar3;
  string local_90;
  string local_70;
  string local_50;
  
  if (msamples < 2) {
    pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "Warning! too short range or too long sampling period: no points can be saved","");
    ChException::ChException(pCVar2,&local_50);
    __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
  }
  if (msamples < 100000) {
    if (mxmin < mxmax) {
      builtin_strncpy(m_file->number_format,"%0.8f",6);
      dVar1 = mxmax - mxmin;
      dVar3 = (double)msamples;
      do {
        ChStreamOutAscii::operator<<(m_file,mxmin);
        ChStreamOutAscii::operator<<(m_file,"    ");
        dVal = mxmin;
        (*this->_vptr_ChFunction[4])(this);
        ChStreamOutAscii::operator<<(m_file,dVal);
        ChStreamOutAscii::operator<<(m_file,"\n");
        mxmin = mxmin + dVar1 / (dVar3 + -1.0);
        msamples = msamples + -1;
      } while (msamples != 0);
      return 1;
    }
    pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Warning! Cannot save ChFunction if Xmax < Xmin","");
    ChException::ChException(pCVar2,&local_90);
    __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
  }
  pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Warning! Too many points should be saved","");
  ChException::ChException(pCVar2,&local_70);
  __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

int ChFunction::FileAsciiPairsSave(ChStreamOutAscii& m_file, double mxmin, double mxmax, int msamples) {
    if (msamples <= 1)
        throw(ChException("Warning! too short range or too long sampling period: no points can be saved"));
    if (msamples >= 100000)
        throw(ChException("Warning! Too many points should be saved"));
    if (mxmax <= mxmin)
        throw(ChException("Warning! Cannot save ChFunction if Xmax < Xmin"));

    m_file.SetNumFormat("%0.8f");

    double period = (mxmax - mxmin) / ((double)msamples - 1);

    double mX = mxmin;
    for (int cnt = 1; cnt <= msamples; cnt++) {
        m_file << mX;
        m_file << "    ";
        m_file << this->Get_y(mX);
        m_file.CR();
        mX += period;
    }
    return 1;
}